

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

word If_Dec7Perform(word *t0,int fDerive)

{
  int iVar1;
  word local_90;
  int local_88 [2];
  int Var2Pla [7];
  int Pla2Var [7];
  int local_44;
  int y;
  int u;
  int v;
  int i;
  word t [2];
  int fDerive_local;
  word *t0_local;
  
  _v = *t0;
  t[0] = t0[1];
  for (u = 0; u < 7; u = u + 1) {
    local_88[u] = u;
    Var2Pla[(long)u + 6] = u;
  }
  y = 0;
  do {
    iVar1 = y;
    if (6 < y) {
      return 0;
    }
    while (local_44 = iVar1 + 1, local_44 < 7) {
      for (Pla2Var[6] = iVar1 + 2; iVar1 = local_44, Pla2Var[6] < 7; Pla2Var[6] = Pla2Var[6] + 1) {
        If_Dec7MoveTo((word *)&v,y,0,Var2Pla + 6,local_88);
        If_Dec7MoveTo((word *)&v,local_44,1,Var2Pla + 6,local_88);
        If_Dec7MoveTo((word *)&v,Pla2Var[6],2,Var2Pla + 6,local_88);
        iVar1 = If_Dec7CofCount3((word *)&v);
        if (iVar1 == 2) {
          if (fDerive == 0) {
            local_90 = 1;
          }
          else {
            local_90 = If_Dec7DeriveDisjoint((word *)&v,Var2Pla + 6,local_88);
          }
          return local_90;
        }
      }
    }
    y = y + 1;
  } while( true );
}

Assistant:

word If_Dec7Perform( word t0[2], int fDerive )
{
    word t[2] = {t0[0], t0[1]}; 
    int i, v, u, y, Pla2Var[7], Var2Pla[7];
    // start arrays
    for ( i = 0; i < 7; i++ )
    {
/*
        if ( i < 6 )
            assert( If_Dec6HasVar( t[0], i ) || If_Dec6HasVar( t[1], i ) );
        else
            assert( t[0] != t[1] );
*/
        Pla2Var[i] = Var2Pla[i] = i;
    }
    // generate permutations
    for ( v = 0;   v < 7; v++ )
    for ( u = v+1; u < 7; u++ )
    for ( y = u+1; y < 7; y++ )
    {
        If_Dec7MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_Dec7MoveTo( t, u, 1, Pla2Var, Var2Pla );
        If_Dec7MoveTo( t, y, 2, Pla2Var, Var2Pla );
//        If_DecVerifyPerm( Pla2Var, Var2Pla );
        if ( If_Dec7CofCount3( t ) == 2 )
        {
            return !fDerive ? 1 : If_Dec7DeriveDisjoint( t, Pla2Var, Var2Pla );
        }
    }
    return 0;
}